

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O2

bool Diligent::VerifyBuildTLASAttribs(BuildTLASAttribs *Attribs,RayTracingProperties *RTProps)

{
  Uint64 *pUVar1;
  Bool BVar2;
  Uint32 UVar3;
  long lVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar7;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  char (*in_RCX) [97];
  char (*Args_1) [60];
  char (*Args_1_00) [121];
  ulong extraout_RDX;
  ulong uVar8;
  char (*Args_3) [36];
  char (*in_R9) [123];
  uint uVar9;
  RayTracingProperties *pRVar10;
  TLASBuildInstanceData *pTVar11;
  string msg;
  Uint32 PrevInstanceCount;
  Uint32 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  long local_60;
  Uint32 *local_58;
  RayTracingProperties *local_50;
  ulong local_48;
  long local_40;
  long local_38;
  long lVar6;
  
  if (Attribs->pTLAS == (ITopLevelAS *)0x0) {
    FormatString<char[33],char[24]>
              ((string *)&stack0xffffffffffffff80,(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])"pTLAS must not be null.",(char (*) [24])in_RCX);
    in_RCX = (char (*) [97])0x32b;
    DebugAssertionFailed
              ((Char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               "VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x32b);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  }
  if (Attribs->pScratchBuffer == (IBuffer *)0x0) {
    FormatString<char[33],char[33]>
              ((string *)&stack0xffffffffffffff80,(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])"pScratchBuffer must not be null.",(char (*) [33])in_RCX);
    in_RCX = (char (*) [97])0x32c;
    DebugAssertionFailed
              ((Char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               "VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x32c);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  }
  if (Attribs->pInstances == (TLASBuildInstanceData *)0x0) {
    FormatString<char[33],char[29]>
              ((string *)&stack0xffffffffffffff80,(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])"pInstances must not be null.",(char (*) [29])in_RCX);
    in_RCX = (char (*) [97])0x32d;
    DebugAssertionFailed
              ((Char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               "VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x32d);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  }
  if (Attribs->pInstanceBuffer == (IBuffer *)0x0) {
    FormatString<char[33],char[34]>
              ((string *)&stack0xffffffffffffff80,(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])"pInstanceBuffer must not be null.",(char (*) [34])in_RCX);
    in_RCX = (char (*) [97])0x32e;
    DebugAssertionFailed
              ((Char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               "VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x32e);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  }
  if ((Attribs->BindingMode != HIT_GROUP_BINDING_MODE_LAST) && (Attribs->HitGroupStride == 0)) {
    FormatString<char[33],char[97]>
              ((string *)&stack0xffffffffffffff80,(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])
               "HitGroupStride must be greater than 0 if BindingMode is not HIT_GROUP_BINDING_MODE_USER_DEFINED."
               ,in_RCX);
    in_RCX = (char (*) [97])0x331;
    DebugAssertionFailed
              ((Char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               "VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x331);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  }
  iVar5 = (*(Attribs->pTLAS->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  lVar6 = CONCAT44(extraout_var,iVar5);
  local_58 = &Attribs->InstanceCount;
  if (*(uint *)(lVar6 + 8) < Attribs->InstanceCount) {
    in_R9 = (char (*) [123])(lVar6 + 8);
    FormatString<char[33],char[16],unsigned_int,char[68],unsigned_int,char[3]>
              ((string *)&stack0xffffffffffffff80,(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])0x7e9cae,(char (*) [16])local_58,
               (uint *)") must be less than or equal to pTLAS->GetDesc().MaxInstanceCount (",
               (char (*) [68])in_R9,(uint *)0x8019c0,
               (char (*) [3])CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    in_RCX = (char (*) [97])0x337;
    DebugAssertionFailed
              ((Char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               "VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x337);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  }
  if (Attribs->Update == true) {
    if ((*(byte *)(lVar6 + 0xc) & 1) == 0) {
      FormatString<char[33],char[80]>
                ((string *)&stack0xffffffffffffff80,(Diligent *)"Build TLAS attribs are invalid: ",
                 (char (*) [33])
                 "Update is true, but TLAS created without RAYTRACING_BUILD_AS_ALLOW_UPDATE flag.",
                 (char (*) [80])in_RCX);
      DebugAssertionFailed
                ((Char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 "VerifyBuildTLASAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x33c);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
    }
    (*(Attribs->pTLAS->super_IDeviceObject).super_IObject._vptr_IObject[9])
              (&stack0xffffffffffffff80);
    local_60 = CONCAT44(local_60._4_4_,in_stack_ffffffffffffff80);
    if (in_stack_ffffffffffffff80 != Attribs->InstanceCount) {
      in_R9 = (char (*) [123])&local_60;
      FormatString<char[33],char[36],unsigned_int,char[38],unsigned_int,char[3]>
                ((string *)&stack0xffffffffffffff80,(Diligent *)"Build TLAS attribs are invalid: ",
                 (char (*) [33])"Update is true, but InstanceCount (",(char (*) [36])local_58,
                 (uint *)") does not match the previous value (",(char (*) [38])in_R9,
                 (uint *)0x8019c0,
                 (char (*) [3])CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      DebugAssertionFailed
                ((Char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 "VerifyBuildTLASAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x340);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
    }
  }
  local_50 = RTProps;
  iVar5 = (*(Attribs->pInstanceBuffer->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  local_40 = CONCAT44(extraout_var_00,iVar5);
  uVar8 = (ulong)Attribs->InstanceCount;
  local_48 = uVar8 << 6;
  uVar7 = 0;
  uVar9 = 0;
  local_38 = local_40;
  while( true ) {
    lVar4 = local_38;
    lVar6 = local_40;
    pRVar10 = local_50;
    local_60 = CONCAT44(local_60._4_4_,(uint)uVar7);
    if ((uint)uVar8 <= (uint)uVar7) break;
    pTVar11 = Attribs->pInstances;
    if (0xffffff < pTVar11[uVar7].CustomId) {
      FormatString<char[33]>
                ((string *)&stack0xffffffffffffff80,
                 (char (*) [33])"Only the lower 24 bits are used.");
      DebugAssertionFailed
                ((Char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 "VerifyBuildTLASAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x34d);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
    }
    pTVar11 = pTVar11 + uVar7;
    if (0x1000000 < pTVar11->ContributionToHitGroupIndex + 1) {
      FormatString<char[33]>
                ((string *)&stack0xffffffffffffff80,
                 (char (*) [33])"Only the lower 24 bits are used.");
      DebugAssertionFailed
                ((Char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 "VerifyBuildTLASAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x351);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
    }
    if (pTVar11->InstanceName == (Char *)0x0) {
      FormatString<char[33],char[12],unsigned_int,char[33]>
                ((string *)&stack0xffffffffffffff80,(Diligent *)"Build TLAS attribs are invalid: ",
                 (char (*) [33])0x7e9d2e,(char (*) [12])&local_60,
                 (uint *)"].InstanceName must not be null.",(char (*) [33])in_R9);
      DebugAssertionFailed
                ((Char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 "VerifyBuildTLASAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x353);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
    }
    if (pTVar11->pBLAS == (IBottomLevelAS *)0x0) {
      FormatString<char[33],char[12],unsigned_int,char[26]>
                ((string *)&stack0xffffffffffffff80,(Diligent *)"Build TLAS attribs are invalid: ",
                 (char (*) [33])0x7e9d2e,(char (*) [12])&local_60,
                 (uint *)"].pBLAS must not be null.",(char (*) [26])in_R9);
      DebugAssertionFailed
                ((Char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 "VerifyBuildTLASAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x354);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
    }
    if (Attribs->Update == true) {
      iVar5 = (*(Attribs->pTLAS->super_IDeviceObject).super_IObject._vptr_IObject[8])
                        (Attribs->pTLAS,pTVar11->InstanceName);
      if (0xfffffffeffffffff < CONCAT44(extraout_var_01,iVar5)) {
        FormatString<char[33],char[32],unsigned_int,char[32]>
                  ((string *)&stack0xffffffffffffff80,(Diligent *)"Build TLAS attribs are invalid: "
                   ,(char (*) [33])"Update is true, but pInstances[",(char (*) [32])&local_60,
                   (uint *)"].InstanceName does not exists.",(char (*) [32])in_R9);
        DebugAssertionFailed
                  ((Char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   "VerifyBuildTLASAttribs",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x359);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
      }
    }
    UVar3 = pTVar11->ContributionToHitGroupIndex;
    if ((Attribs->BindingMode != HIT_GROUP_BINDING_MODE_LAST) && (UVar3 != 0xffffffff)) {
      FormatString<char[33],char[12],unsigned_int,char[123]>
                ((string *)&stack0xffffffffffffff80,(Diligent *)"Build TLAS attribs are invalid: ",
                 (char (*) [33])0x7e9d2e,(char (*) [12])&local_60,
                 (uint *)
                 "].ContributionToHitGroupIndex must be TLAS_INSTANCE_OFFSET_AUTO if BindingMode is not HIT_GROUP_BINDING_MODE_USER_DEFINED."
                 ,in_R9);
      DebugAssertionFailed
                ((Char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 "VerifyBuildTLASAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x362);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
    }
    uVar9 = uVar9 + (UVar3 == 0xffffffff);
    uVar7 = (ulong)((int)local_60 + 1);
    uVar8 = (ulong)*local_58;
  }
  if (uVar9 != (uint)uVar8 && uVar9 != 0) {
    FormatString<char[33],char[105]>
              ((string *)&stack0xffffffffffffff80,(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])
               "all pInstances[i].ContributionToHitGroupIndex must be TLAS_INSTANCE_OFFSET_AUTO, or none of them should."
               ,(char (*) [105])CONCAT71((int7)(uVar7 >> 8),uVar9 == 0));
    DebugAssertionFailed
              ((Char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               "VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x366);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  }
  pUVar1 = &Attribs->InstanceBufferOffset;
  uVar7 = Attribs->InstanceBufferOffset;
  Args_3 = (char (*) [36])(lVar6 + 8);
  uVar8 = *(ulong *)(lVar4 + 8);
  if (uVar8 < uVar7) {
    FormatString<char[33],char[23],unsigned_long,char[36],unsigned_long,char[3]>
              ((string *)&stack0xffffffffffffff80,(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])"InstanceBufferOffset (",(char (*) [23])pUVar1,
               (unsigned_long *)") is greater than the buffer size (",Args_3,
               (unsigned_long *)0x8019c0,
               (char (*) [3])CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    DebugAssertionFailed
              ((Char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               "VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x369);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
    uVar8 = *(ulong *)*Args_3;
    uVar7 = *pUVar1;
  }
  if (uVar8 - uVar7 < local_48) {
    local_60 = uVar7 + local_48;
    FormatString<char[33],char[23],unsigned_long,char[26],unsigned_long,char[21]>
              ((string *)&stack0xffffffffffffff80,(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])"pInstanceBuffer size (",(char (*) [23])Args_3,
               (unsigned_long *)") is too small: at least ",(char (*) [26])&local_60,
               (unsigned_long *)" bytes are required.",
               (char (*) [21])CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    DebugAssertionFailed
              ((Char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               "VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x36d);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
    uVar7 = *pUVar1;
  }
  Args_1 = (char (*) [60])(ulong)pRVar10->InstanceBufferAlignment;
  if (uVar7 % (ulong)Args_1 != 0) {
    FormatString<char[33],char[23],unsigned_long,char[22],unsigned_int,char[50]>
              ((string *)&stack0xffffffffffffff80,(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])"InstanceBufferOffset (",(char (*) [23])pUVar1,
               (unsigned_long *)") must be aligned by ",
               (char (*) [22])&pRVar10->InstanceBufferAlignment,
               (uint *)" (RayTracingProperties::InstanceBufferAlignment).",
               (char (*) [50])CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    Args_1 = (char (*) [60])0x371;
    DebugAssertionFailed
              ((Char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               "VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x371);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  }
  if ((*(byte *)(lVar4 + 0x11) & 4) == 0) {
    FormatString<char[33],char[60]>
              ((string *)&stack0xffffffffffffff80,(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])"pInstanceBuffer was not created with BIND_RAY_TRACING flag.",Args_1);
    DebugAssertionFailed
              ((Char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               "VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x374);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  }
  iVar5 = (*(Attribs->pScratchBuffer->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  lVar6 = CONCAT44(extraout_var_02,iVar5);
  pUVar1 = &Attribs->ScratchBufferOffset;
  uVar8 = Attribs->ScratchBufferOffset;
  if (*(ulong *)(lVar6 + 8) < uVar8) {
    FormatString<char[33],char[22],unsigned_long,char[36],unsigned_long,char[3]>
              ((string *)&stack0xffffffffffffff80,(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])"ScratchBufferOffset (",(char (*) [22])pUVar1,
               (unsigned_long *)") is greater than the buffer size (",(char (*) [36])(lVar6 + 8),
               (unsigned_long *)0x8019c0,
               (char (*) [3])CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    DebugAssertionFailed
              ((Char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               "VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x379);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
    uVar8 = *pUVar1;
    pRVar10 = local_50;
  }
  Args_1_00 = (char (*) [121])(ulong)pRVar10->ScratchBufferAlignment;
  if (uVar8 % (ulong)Args_1_00 != 0) {
    FormatString<char[33],char[22],unsigned_long,char[22],unsigned_int,char[49]>
              ((string *)&stack0xffffffffffffff80,(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])"ScratchBufferOffset (",(char (*) [22])pUVar1,
               (unsigned_long *)") must be aligned by ",
               (char (*) [22])&pRVar10->ScratchBufferAlignment,
               (uint *)" (RayTracingProperties::ScratchBufferAlignment).",
               (char (*) [49])CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    Args_1_00 = (char (*) [121])0x37d;
    DebugAssertionFailed
              ((Char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               "VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x37d);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  }
  BVar2 = Attribs->Update;
  uVar8 = *(long *)*(char (*) [36])(lVar6 + 8) - Attribs->ScratchBufferOffset;
  iVar5 = (*(Attribs->pTLAS->super_IDeviceObject).super_IObject._vptr_IObject[10])();
  if (BVar2 == true) {
    if (extraout_RDX <= uVar8) goto LAB_0058c99c;
    FormatString<char[33],char[121]>
              ((string *)&stack0xffffffffffffff80,(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])
               "pScratchBuffer size is too small, use pTLAS->GetScratchBufferSizes().Update to get the required size for scratch buffer."
               ,Args_1_00);
    Args_1_00 = (char (*) [121])0x382;
    DebugAssertionFailed
              ((Char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               "VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x382);
  }
  else {
    if (CONCAT44(extraout_var_03,iVar5) <= uVar8) goto LAB_0058c99c;
    FormatString<char[33],char[120]>
              ((string *)&stack0xffffffffffffff80,(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])
               "pScratchBuffer size is too small, use pTLAS->GetScratchBufferSizes().Build to get the required size for scratch buffer."
               ,(char (*) [120])Args_1_00);
    Args_1_00 = (char (*) [121])0x387;
    DebugAssertionFailed
              ((Char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               "VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x387);
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
LAB_0058c99c:
  if ((*(byte *)(lVar6 + 0x11) & 4) == 0) {
    FormatString<char[33],char[59]>
              ((string *)&stack0xffffffffffffff80,(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])"pScratchBuffer was not created with BIND_RAY_TRACING flag.",
               (char (*) [59])Args_1_00);
    DebugAssertionFailed
              ((Char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               "VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x38b);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  }
  return true;
}

Assistant:

bool VerifyBuildTLASAttribs(const BuildTLASAttribs& Attribs, const RayTracingProperties& RTProps)
{
#define CHECK_BUILD_TLAS_ATTRIBS(Expr, ...) CHECK_PARAMETER(Expr, "Build TLAS attribs are invalid: ", __VA_ARGS__)

    CHECK_BUILD_TLAS_ATTRIBS(Attribs.pTLAS != nullptr, "pTLAS must not be null.");
    CHECK_BUILD_TLAS_ATTRIBS(Attribs.pScratchBuffer != nullptr, "pScratchBuffer must not be null.");
    CHECK_BUILD_TLAS_ATTRIBS(Attribs.pInstances != nullptr, "pInstances must not be null.");
    CHECK_BUILD_TLAS_ATTRIBS(Attribs.pInstanceBuffer != nullptr, "pInstanceBuffer must not be null.");

    CHECK_BUILD_TLAS_ATTRIBS(Attribs.BindingMode == HIT_GROUP_BINDING_MODE_USER_DEFINED || Attribs.HitGroupStride != 0,
                             "HitGroupStride must be greater than 0 if BindingMode is not HIT_GROUP_BINDING_MODE_USER_DEFINED.");

    const TopLevelASDesc& TLASDesc = Attribs.pTLAS->GetDesc();

    CHECK_BUILD_TLAS_ATTRIBS(Attribs.InstanceCount <= TLASDesc.MaxInstanceCount,
                             "InstanceCount (", Attribs.InstanceCount, ") must be less than or equal to pTLAS->GetDesc().MaxInstanceCount (",
                             TLASDesc.MaxInstanceCount, ").");

    if (Attribs.Update)
    {
        CHECK_BUILD_TLAS_ATTRIBS((TLASDesc.Flags & RAYTRACING_BUILD_AS_ALLOW_UPDATE) == RAYTRACING_BUILD_AS_ALLOW_UPDATE,
                                 "Update is true, but TLAS created without RAYTRACING_BUILD_AS_ALLOW_UPDATE flag.");

        const Uint32 PrevInstanceCount = Attribs.pTLAS->GetBuildInfo().InstanceCount;
        CHECK_BUILD_TLAS_ATTRIBS(PrevInstanceCount == Attribs.InstanceCount,
                                 "Update is true, but InstanceCount (", Attribs.InstanceCount, ") does not match the previous value (", PrevInstanceCount, ").");
    }

    const BufferDesc& InstDesc          = Attribs.pInstanceBuffer->GetDesc();
    const size_t      InstDataSize      = size_t{Attribs.InstanceCount} * size_t{TLAS_INSTANCE_DATA_SIZE};
    Uint32            AutoOffsetCounter = 0;

    // Calculate instance data size
    for (Uint32 i = 0; i < Attribs.InstanceCount; ++i)
    {
        constexpr Uint32             BitMask = (1u << 24) - 1;
        const TLASBuildInstanceData& Inst    = Attribs.pInstances[i];

        VERIFY((Inst.CustomId & ~BitMask) == 0, "Only the lower 24 bits are used.");

        VERIFY(Inst.ContributionToHitGroupIndex == TLAS_INSTANCE_OFFSET_AUTO ||
                   (Inst.ContributionToHitGroupIndex & ~BitMask) == 0,
               "Only the lower 24 bits are used.");

        CHECK_BUILD_TLAS_ATTRIBS(Inst.InstanceName != nullptr, "pInstances[", i, "].InstanceName must not be null.");
        CHECK_BUILD_TLAS_ATTRIBS(Inst.pBLAS != nullptr, "pInstances[", i, "].pBLAS must not be null.");

        if (Attribs.Update)
        {
            const TLASInstanceDesc IDesc = Attribs.pTLAS->GetInstanceDesc(Inst.InstanceName);
            CHECK_BUILD_TLAS_ATTRIBS(IDesc.InstanceIndex != INVALID_INDEX, "Update is true, but pInstances[", i, "].InstanceName does not exists.");
        }

        if (Inst.ContributionToHitGroupIndex == TLAS_INSTANCE_OFFSET_AUTO)
            ++AutoOffsetCounter;

        CHECK_BUILD_TLAS_ATTRIBS(Attribs.BindingMode == HIT_GROUP_BINDING_MODE_USER_DEFINED || Inst.ContributionToHitGroupIndex == TLAS_INSTANCE_OFFSET_AUTO,
                                 "pInstances[", i,
                                 "].ContributionToHitGroupIndex must be TLAS_INSTANCE_OFFSET_AUTO "
                                 "if BindingMode is not HIT_GROUP_BINDING_MODE_USER_DEFINED.");
    }

    CHECK_BUILD_TLAS_ATTRIBS(AutoOffsetCounter == 0 || AutoOffsetCounter == Attribs.InstanceCount,
                             "all pInstances[i].ContributionToHitGroupIndex must be TLAS_INSTANCE_OFFSET_AUTO, or none of them should.");

    CHECK_BUILD_TLAS_ATTRIBS(Attribs.InstanceBufferOffset <= InstDesc.Size,
                             "InstanceBufferOffset (", Attribs.InstanceBufferOffset, ") is greater than the buffer size (", InstDesc.Size, ").");

    CHECK_BUILD_TLAS_ATTRIBS(InstDesc.Size - Attribs.InstanceBufferOffset >= InstDataSize,
                             "pInstanceBuffer size (", InstDesc.Size, ") is too small: at least ",
                             InstDataSize + Attribs.InstanceBufferOffset, " bytes are required.");

    CHECK_BUILD_TLAS_ATTRIBS(Attribs.InstanceBufferOffset % RTProps.InstanceBufferAlignment == 0,
                             "InstanceBufferOffset (", Attribs.InstanceBufferOffset, ") must be aligned by ", RTProps.InstanceBufferAlignment,
                             " (RayTracingProperties::InstanceBufferAlignment).");

    CHECK_BUILD_TLAS_ATTRIBS((InstDesc.BindFlags & BIND_RAY_TRACING) == BIND_RAY_TRACING,
                             "pInstanceBuffer was not created with BIND_RAY_TRACING flag.");

    const BufferDesc& ScratchDesc = Attribs.pScratchBuffer->GetDesc();

    CHECK_BUILD_TLAS_ATTRIBS(Attribs.ScratchBufferOffset <= ScratchDesc.Size,
                             "ScratchBufferOffset (", Attribs.ScratchBufferOffset, ") is greater than the buffer size (", ScratchDesc.Size, ").");

    CHECK_BUILD_TLAS_ATTRIBS(Attribs.ScratchBufferOffset % RTProps.ScratchBufferAlignment == 0,
                             "ScratchBufferOffset (", Attribs.ScratchBufferOffset, ") must be aligned by ", RTProps.ScratchBufferAlignment,
                             " (RayTracingProperties::ScratchBufferAlignment).");

    if (Attribs.Update)
    {
        CHECK_BUILD_TLAS_ATTRIBS(ScratchDesc.Size - Attribs.ScratchBufferOffset >= Attribs.pTLAS->GetScratchBufferSizes().Update,
                                 "pScratchBuffer size is too small, use pTLAS->GetScratchBufferSizes().Update to get the required size for scratch buffer.");
    }
    else
    {
        CHECK_BUILD_TLAS_ATTRIBS(ScratchDesc.Size - Attribs.ScratchBufferOffset >= Attribs.pTLAS->GetScratchBufferSizes().Build,
                                 "pScratchBuffer size is too small, use pTLAS->GetScratchBufferSizes().Build to get the required size for scratch buffer.");
    }

    CHECK_BUILD_TLAS_ATTRIBS((ScratchDesc.BindFlags & BIND_RAY_TRACING) == BIND_RAY_TRACING,
                             "pScratchBuffer was not created with BIND_RAY_TRACING flag.");
#undef CHECK_BUILD_TLAS_ATTRIBS

    return true;
}